

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

void draw_demo_menu(DEMO_MENU *menu)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DEMO_MENU *pDVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  char *pcVar14;
  undefined4 uVar15;
  float fVar16;
  undefined8 uVar17;
  
  draw_background();
  draw_credits();
  iVar3 = screen_width / 2;
  iVar8 = screen_height / 6;
  iVar2 = al_get_font_line_height(demo_data[2].dat);
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar17 = 0x3e000000;
  pcVar14 = (char *)al_map_rgba_f(0x3e000000,0x3e000000,0x3e000000,0x3e800000);
  demo_textprintf_centre(pAVar1,iVar3 + 6,iVar2 / -2 + 5 + iVar8,0x1179d8,pcVar14,uVar17);
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar17 = 0x3f800000;
  pcVar14 = (char *)al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  demo_textprintf_centre(pAVar1,iVar3,iVar2 / -2 + iVar8,0x1179d8,pcVar14,uVar17);
  iVar8 = 0;
  for (pDVar7 = menu; pDVar7->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0; pDVar7 = pDVar7 + 1) {
    iVar3 = (*pDVar7->proc)(pDVar7,5,0);
    iVar8 = iVar8 + iVar3;
  }
  iVar3 = screen_height * 3;
  iVar2 = (iVar8 + 0x10) / -2;
  iVar5 = 0;
  pDVar7 = menu;
  while( true ) {
    if (pDVar7->proc == (_func_int_DEMO_MENU_ptr_int_int *)0x0) break;
    iVar4 = (*pDVar7->proc)(pDVar7,4,0);
    pDVar7->w = iVar4;
    pDVar7->x = (screen_width - iVar4) / 2;
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pDVar7 = pDVar7 + 1;
  }
  iVar3 = iVar3 / 5;
  iVar4 = iVar5 + 0x10;
  if (iVar5 + 0x10 <= screen_width / 3) {
    iVar4 = screen_width / 3;
  }
  if (screen_width <= iVar4) {
    iVar4 = screen_width;
  }
  iVar5 = (screen_width - iVar4) / 2;
  fVar9 = (float)iVar5;
  iVar6 = iVar3 + iVar2;
  fVar10 = (float)iVar6;
  fVar11 = (float)(iVar4 + iVar5);
  fVar12 = (float)(iVar8 + 0x10 + iVar6);
  uVar15 = 0x3e810625;
  uVar13 = al_map_rgba_f(0x3e6353f8,0x3e810625,0x3e8a3d71,0x3f19999a);
  fVar16 = fVar10;
  al_draw_filled_rectangle(fVar9,fVar10,fVar11,fVar12,uVar13,uVar15);
  uVar13 = al_map_rgb(0,0,0);
  al_draw_rectangle(fVar9,fVar10,fVar11,fVar12,uVar13,fVar16,0x3f800000);
  iVar8 = iVar3 + iVar2 + 8;
  for (; menu->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0; menu = menu + 1) {
    (*menu->proc)(menu,1,iVar8);
    menu->y = iVar8;
    iVar3 = (*menu->proc)(menu,5,0);
    menu->h = iVar3;
    iVar8 = iVar8 + iVar3;
  }
  return;
}

Assistant:

void draw_demo_menu(DEMO_MENU * menu)
{
   int i, x, y, h, w;
   int tmp;
   static char logo_text[] = "Demo Game";

   draw_background();
   draw_credits();

   x = screen_width / 2;
   y = 1 * screen_height / 6 - al_get_font_line_height(demo_font_logo) / 2;
   demo_textprintf_centre(demo_font_logo, x + 6, y + 5,
                        al_map_rgba_f(0.125, 0.125, 0.125, 0.25), logo_text);
   demo_textprintf_centre(demo_font_logo, x, y, al_map_rgb_f(1, 1, 1), logo_text);

   /* calculate height of the whole menu and the starting y coordinate */
   h = 0;
   for (i = 0, h = 0; menu[i].proc != NULL; i++) {
      h += menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
   }
   h += 2 * 8;
   y = 3 * screen_height / 5 - h / 2;

   /* calculate the width of the whole menu */
   w = 0;
   for (i = 0; menu[i].proc != NULL; i++) {
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_WIDTH, 0);
      menu[i].w = tmp;
      menu[i].x = (screen_width - tmp) / 2;
      if (tmp > w) {
         w = tmp;
      }
   }
   w += 2 * 8;
   if (w < screen_width / 3) w =  screen_width / 3;
   if (w > screen_width) w = screen_width;
   x = (screen_width - w) / 2;

   /* draw menu background */
   al_draw_filled_rectangle(x, y, x + w, y + h,
      al_map_rgba_f(0.37 * 0.6, 0.42 * 0.6, 0.45 * 0.6, 0.6));
   al_draw_rectangle(x, y, x + w, y + h, al_map_rgb(0, 0, 0), 1);

   /* draw menu items */
   y += 8;
   for (i = 0; menu[i].proc != NULL; i++) {
      menu[i].proc(&menu[i], DEMO_MENU_MSG_DRAW, y);
      menu[i].y = y;
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
      menu[i].h = tmp;
      y += tmp;
   }
}